

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar5 = Abc_FrameReadNtk(pAbc);
  local_48 = 0;
  Extra_UtilGetoptReset();
  local_5c = 0x14;
  local_58 = 100000;
  bVar1 = true;
  local_4c = 0;
  local_44 = 1;
  bVar2 = false;
  local_60 = 0;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"NSmfbiavh"), iVar8 = globalUtilOptind, 0x60 < iVar3)
    {
      switch(iVar3) {
      case 0x61:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 0x62:
        local_4c = local_4c ^ 1;
        break;
      case 99:
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
        goto switchD_002667ea_caseD_63;
      case 0x66:
        local_48 = local_48 ^ 1;
        break;
      case 0x69:
        local_44 = local_44 ^ 1;
        break;
      default:
        if (iVar3 == 0x6d) {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else {
          if (iVar3 != 0x76) goto switchD_002667ea_caseD_63;
          local_60 = local_60 ^ 1;
        }
      }
    }
    if (iVar3 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by a positive integer.\n";
LAB_002668e0:
        Abc_Print(-1,pcVar6);
        break;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_5c = uVar4;
    }
    else {
      if (iVar3 != 0x53) {
        if (iVar3 == -1) {
          if (pAVar5 == (Abc_Ntk_t *)0x0) {
            pcVar6 = "Empty network.\n";
          }
          else {
            if (pAVar5->nObjCounts[8] == 0) {
              return 0;
            }
            if (pAVar5->ntkType != ABC_NTK_STRASH) {
              Abc_Print(-1,"This command works only for structrally hashed networks. Run \"st\".\n")
              ;
              return 0;
            }
            if (bVar1) {
              pAVar5 = Abc_NtkDarRetimeMinArea(pAVar5,local_5c,local_48,local_4c,local_44,local_60);
            }
            else if (bVar2) {
              pAVar5 = Abc_NtkDarRetime(pAVar5,local_58,local_60);
            }
            else {
              pAVar5 = Abc_NtkDarRetimeMostFwd(pAVar5,local_5c,local_60);
            }
            if (pAVar5 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar5);
              return 0;
            }
            pcVar6 = "Retiming has failed.\n";
          }
          iVar8 = -1;
          goto LAB_00266a1f;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by a positive integer.\n";
        goto LAB_002668e0;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_58 = uVar4;
    }
    globalUtilOptind = iVar8 + 1;
  } while (-1 < (int)uVar4);
switchD_002667ea_caseD_63:
  Abc_Print(-2,"usage: dretime [-NS num] [-mfbiavh]\n");
  Abc_Print(-2,"\t         new implementation of min-area (or most-forward) retiming\n");
  pcVar6 = "min-area";
  if (!bVar1) {
    pcVar6 = "most-fwd";
  }
  Abc_Print(-2,"\t-m     : toggle min-area retiming and most-forward retiming [default = %s]\n",
            pcVar6);
  pcVar7 = "yes";
  pcVar6 = "yes";
  if (local_48 == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-f     : enables forward-only retiming [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_4c == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-b     : enables backward-only retiming [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_44 == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-i     : enables init state computation [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-N num : the max number of one-frame iterations to perform [default = %d]\n",
            (ulong)local_5c);
  Abc_Print(-2,"\t-S num : the max number of forward retiming steps to perform [default = %d]\n",
            (ulong)local_58);
  pcVar6 = "yes";
  if (!bVar2) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-a     : enables a fast most-forward algorithm [default = %s]\n",pcVar6);
  if (local_60 == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-v     : enables verbose output [default = %s]\n",pcVar7);
  pcVar6 = "\t-h     : print the command usage\n";
  iVar8 = -2;
LAB_00266a1f:
  Abc_Print(iVar8,pcVar6);
  return 1;
}

Assistant:

int Abc_CommandDRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fMinArea;
    int fForwardOnly;
    int fBackwardOnly;
    int fInitial;
    int nStepsMax;
    int fFastAlgo;
    int fVerbose;
    int c, nMaxIters;
    extern Abc_Ntk_t * Abc_NtkDarRetime( Abc_Ntk_t * pNtk, int nStepsMax, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarRetimeF( Abc_Ntk_t * pNtk, int nStepsMax, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarRetimeMinArea( Abc_Ntk_t * pNtk, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarRetimeMostFwd( Abc_Ntk_t * pNtk, int nMaxIters, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMinArea  = 1;
    fForwardOnly = 0;
    fBackwardOnly = 0;
    fInitial = 1;
    nStepsMax = 100000;
    fFastAlgo = 0;
    nMaxIters = 20;
    fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSmfbiavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nMaxIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxIters < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nStepsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStepsMax < 0 )
                goto usage;
            break;
        case 'm':
            fMinArea ^= 1;
            break;
        case 'f':
            fForwardOnly ^= 1;
            break;
        case 'b':
            fBackwardOnly ^= 1;
            break;
        case 'i':
            fInitial ^= 1;
            break;
        case 'a':
            fFastAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
//        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    // perform the retiming
    if ( fMinArea )
        pNtkRes = Abc_NtkDarRetimeMinArea( pNtk, nMaxIters, fForwardOnly, fBackwardOnly, fInitial, fVerbose );
    else if ( fFastAlgo )
        pNtkRes = Abc_NtkDarRetime( pNtk, nStepsMax, fVerbose );
    else
//        pNtkRes = Abc_NtkDarRetimeF( pNtk, nStepsMax, fVerbose );
        pNtkRes = Abc_NtkDarRetimeMostFwd( pNtk, nMaxIters, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Retiming has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dretime [-NS num] [-mfbiavh]\n" );
    Abc_Print( -2, "\t         new implementation of min-area (or most-forward) retiming\n" );
    Abc_Print( -2, "\t-m     : toggle min-area retiming and most-forward retiming [default = %s]\n", fMinArea? "min-area": "most-fwd" );
    Abc_Print( -2, "\t-f     : enables forward-only retiming [default = %s]\n", fForwardOnly? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming [default = %s]\n", fBackwardOnly? "yes": "no" );
    Abc_Print( -2, "\t-i     : enables init state computation [default = %s]\n", fInitial? "yes": "no" );
    Abc_Print( -2, "\t-N num : the max number of one-frame iterations to perform [default = %d]\n", nMaxIters );
    Abc_Print( -2, "\t-S num : the max number of forward retiming steps to perform [default = %d]\n", nStepsMax );
    Abc_Print( -2, "\t-a     : enables a fast most-forward algorithm [default = %s]\n", fFastAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}